

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

int is_same_type(dmr_C *C,expression *expr,symbol *news)

{
  ulong uVar1;
  char *local_60;
  char *tofrom;
  unsigned_long difmod;
  unsigned_long newas;
  unsigned_long oldas;
  unsigned_long newmod;
  unsigned_long oldmod;
  symbol *old;
  symbol *news_local;
  expression *expr_local;
  dmr_C *C_local;
  
  oldmod = (unsigned_long)expr->ctype;
  old = news;
  news_local = (symbol *)expr;
  expr_local = (expression *)C;
  oldmod = (unsigned_long)base_type((symbol *)oldmod,&newmod,&newas);
  old = base_type(old,&oldas,&difmod);
  if (((symbol *)oldmod == old) && (newas == difmod)) {
    uVar1 = (newmod ^ oldas) & 0xffffffffffefffff;
    if (uVar1 == 0) {
      return 1;
    }
    if (uVar1 == 0x10) {
      return 0;
    }
  }
  if (((newmod | oldas) & 0x100000) != 0) {
    local_60 = "to/from";
    if ((oldas & 0x100000) == 0) {
      local_60 = "from";
    }
    if ((newmod & 0x100000) == 0) {
      local_60 = "to";
    }
    dmrC_warning((dmr_C *)expr_local,*(position *)&(news_local->pos).field_0x4,
                 "implicit cast %s nocast type",local_60);
  }
  return 0;
}

Assistant:

static int is_same_type(struct dmr_C *C, struct expression *expr, struct symbol *news)
{
	struct symbol *old = expr->ctype;
	unsigned long oldmod, newmod, oldas, newas;

	old = base_type(old, &oldmod, &oldas);
	news = base_type(news, &newmod, &newas);

	/* Same base type, same address space? */
	if (old == news && oldas == newas) {
		unsigned long difmod;

		/* Check the modifier bits. */
		difmod = (oldmod ^ newmod) & ~MOD_NOCAST;

		/* Exact same type? */
		if (!difmod)
			return 1;

		/*
		 * Not the same type, but differs only in "const".
		 * Don't warn about MOD_NOCAST.
		 */
		if (difmod == MOD_CONST)
			return 0;
	}
	if ((oldmod | newmod) & MOD_NOCAST) {
		const char *tofrom = "to/from";
		if (!(newmod & MOD_NOCAST))
			tofrom = "from";
		if (!(oldmod & MOD_NOCAST))
			tofrom = "to";
		dmrC_warning(C, expr->pos, "implicit cast %s nocast type", tofrom);
	}
	return 0;
}